

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O3

ssize_t __thiscall RunWriter::write(RunWriter *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  ssize_t sVar2;
  ulong uVar3;
  
  uVar3 = ~this->prev + (ulong)(uint)__fd;
  if (0x7f < (long)uVar3) {
    do {
      this->out_bytes = this->out_bytes + 1;
      std::ostream::put((char)this->out);
      bVar1 = 0x3fff < uVar3;
      uVar3 = uVar3 >> 7;
    } while (bVar1);
  }
  this->out_bytes = this->out_bytes + 1;
  sVar2 = std::ostream::put((char)this->out);
  this->prev = (ulong)(uint)__fd;
  return sVar2;
}

Assistant:

void RunWriter::write(FileId next) {
    assert(next > prev);
    int64_t diff = (next - prev) - 1;
    while (diff >= 0x80U) {
        out_bytes++;
        out->put(static_cast<uint8_t>(0x80U | (diff & 0x7FU)));
        diff >>= 7;
    }
    out_bytes++;
    out->put(static_cast<uint8_t>(diff));
    prev = next;
}